

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void * google::protobuf::internal::CreateSplitMessageGeneric
                 (Arena *arena,void *default_split,size_t size,void *message,void *default_message)

{
  Nullable<const_char_*> failure_msg;
  void *__dest;
  void *default_message_local;
  void *message_local;
  LogMessageFatal local_28;
  
  default_message_local = default_message;
  message_local = message;
  failure_msg = absl::lts_20250127::log_internal::Check_NEImpl<void_const*,void_const*>
                          (&message_local,&default_message_local,"message != default_message");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    if (arena == (Arena *)0x0) {
      __dest = operator_new(size);
    }
    else {
      __dest = Arena::AllocateAligned(arena,size,8);
    }
    memcpy(__dest,default_split,size);
    return __dest;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
             ,0xf2,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_28);
}

Assistant:

void* CreateSplitMessageGeneric(Arena* arena, const void* default_split,
                                size_t size, const void* message,
                                const void* default_message) {
  ABSL_DCHECK_NE(message, default_message);
  void* split =
      (arena == nullptr) ? ::operator new(size) : arena->AllocateAligned(size);
  memcpy(split, default_split, size);
  return split;
}